

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jama_lu.h
# Opt level: O1

Array2D<double> * __thiscall
JAMA::LU<double>::solve(Array2D<double> *__return_storage_ptr__,LU<double> *this,Array2D<double> *B)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  double **ppdVar4;
  double **ppdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  double **ppdVar9;
  double **ppdVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  
  if (B->m_ == this->m) {
    uVar11 = (ulong)this->n;
    bVar18 = (long)uVar11 < 1;
    if (0 < (long)uVar11) {
      ppdVar4 = (this->LU_).v_.data_;
      dVar1 = **ppdVar4;
      if ((dVar1 == 0.0) && (!NAN(dVar1))) goto LAB_0016a722;
      uVar17 = 1;
      do {
        uVar14 = uVar17;
        if (uVar11 == uVar14) break;
        dVar1 = ppdVar4[uVar14][uVar14];
        uVar17 = uVar14 + 1;
      } while ((dVar1 != 0.0) || (NAN(dVar1)));
      bVar18 = uVar11 <= uVar14;
    }
    if (bVar18) {
      uVar2 = B->n_;
      uVar17 = (ulong)uVar2;
      permute_copy(__return_storage_ptr__,this,B,&this->piv,0,uVar2 - 1);
      iVar3 = this->n;
      uVar11 = (ulong)iVar3;
      if (0 < (long)uVar11) {
        uVar12 = 1;
        uVar14 = 0;
        do {
          uVar13 = uVar14 + 1;
          if (uVar13 < uVar11) {
            ppdVar4 = (__return_storage_ptr__->v_).data_;
            ppdVar5 = (this->LU_).v_.data_;
            uVar15 = uVar12;
            do {
              if (0 < (int)uVar2) {
                pdVar6 = ppdVar4[uVar14];
                pdVar7 = ppdVar5[uVar15];
                pdVar8 = ppdVar4[uVar15];
                uVar16 = 0;
                do {
                  pdVar8[uVar16] = pdVar8[uVar16] - pdVar6[uVar16] * pdVar7[uVar14];
                  uVar16 = uVar16 + 1;
                } while (uVar17 != uVar16);
              }
              uVar15 = uVar15 + 1;
            } while (uVar15 != uVar11);
          }
          uVar12 = uVar12 + 1;
          uVar14 = uVar13;
        } while (uVar13 != uVar11);
      }
      if (iVar3 < 1) {
        return __return_storage_ptr__;
      }
      ppdVar4 = (this->LU_).v_.data_;
      ppdVar5 = (__return_storage_ptr__->v_).data_;
      uVar14 = (ulong)(iVar3 - 1);
      do {
        uVar12 = uVar11 - 1;
        if (0 < (int)uVar2) {
          pdVar6 = ppdVar4[uVar12];
          pdVar7 = ppdVar5[uVar12];
          uVar13 = 0;
          do {
            pdVar7[uVar13] = pdVar7[uVar13] / pdVar6[uVar12];
            uVar13 = uVar13 + 1;
          } while (uVar17 != uVar13);
        }
        if (1 < (long)uVar11) {
          ppdVar9 = (__return_storage_ptr__->v_).data_;
          ppdVar10 = (this->LU_).v_.data_;
          uVar13 = 0;
          do {
            if (0 < (int)uVar2) {
              pdVar6 = ppdVar9[uVar12];
              pdVar7 = ppdVar10[uVar13];
              pdVar8 = ppdVar9[uVar13];
              uVar15 = 0;
              do {
                pdVar8[uVar15] = pdVar8[uVar15] - pdVar6[uVar15] * pdVar7[uVar12];
                uVar15 = uVar15 + 1;
              } while (uVar17 != uVar15);
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 != uVar14);
        }
        uVar14 = uVar14 - 1;
        bVar18 = 1 < (long)uVar11;
        uVar11 = uVar12;
      } while (bVar18);
      return __return_storage_ptr__;
    }
  }
LAB_0016a722:
  TNT::Array2D<double>::Array2D(__return_storage_ptr__,0,0);
  return __return_storage_ptr__;
}

Assistant:

Array2D<Real> solve (const Array2D<Real> &B) 
   {

	  /* Dimensions: A is mxn, X is nxk, B is mxk */
      
      if (B.dim1() != m) {
	  	return Array2D<Real>(0,0);
      }
      if (!isNonsingular()) {
        return Array2D<Real>(0,0);
      }

      // Copy right hand side with pivoting
      int nx = B.dim2();


	  Array2D<Real> X = permute_copy(B, piv, 0, nx-1);

      // Solve L*Y = B(piv,:)
      for (int k = 0; k < n; k++) {
         for (int i = k+1; i < n; i++) {
            for (int j = 0; j < nx; j++) {
               X[i][j] -= X[k][j]*LU_[i][k];
            }
         }
      }
      // Solve U*X = Y;
      for (int k = n-1; k >= 0; k--) {
         for (int j = 0; j < nx; j++) {
            X[k][j] /= LU_[k][k];
         }
         for (int i = 0; i < k; i++) {
            for (int j = 0; j < nx; j++) {
               X[i][j] -= X[k][j]*LU_[i][k];
            }
         }
      }
      return X;
   }